

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadtexture.hpp
# Opt level: O0

GLuint create_2D_float_texture
                 (int width,int height,int n_channel,float *data,GLint sample_method,bool gen_mipmap
                 )

{
  GLuint local_2c;
  byte local_25;
  GLuint texture;
  bool gen_mipmap_local;
  float *pfStack_20;
  GLint sample_method_local;
  float *data_local;
  int local_10;
  int n_channel_local;
  int height_local;
  int width_local;
  
  local_25 = gen_mipmap;
  texture = sample_method;
  pfStack_20 = data;
  data_local._4_4_ = n_channel;
  local_10 = height;
  n_channel_local = width;
  (*glad_glGenTextures)(1,&local_2c);
  (*glad_glBindTexture)(0xde1,local_2c);
  (*glad_glTexParameteri)(0xde1,0x2801,texture);
  (*glad_glTexParameteri)(0xde1,0x2800,texture);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
  if (data_local._4_4_ == 1) {
    (*glad_glTexImage2D)(0xde1,0,0x822e,n_channel_local,local_10,0,0x1903,0x1406,pfStack_20);
  }
  if (data_local._4_4_ == 3) {
    (*glad_glTexImage2D)(0xde1,0,0x8815,n_channel_local,local_10,0,0x1907,0x1406,pfStack_20);
  }
  if (data_local._4_4_ == 4) {
    (*glad_glTexImage2D)(0xde1,0,0x8814,n_channel_local,local_10,0,0x1908,0x1406,pfStack_20);
  }
  if ((local_25 & 1) != 0) {
    (*glad_glGenerateMipmap)(0xde1);
  }
  return local_2c;
}

Assistant:

GLuint create_2D_float_texture(int width, int height, int n_channel, const float* data, GLint sample_method, bool gen_mipmap = false)
{
	// create & bind a named texture
	GLuint texture;
	glGenTextures(1, &texture);  
	glBindTexture(GL_TEXTURE_2D, texture);
	// set the texture wrapping/filtering options (on the currently bound texture object)
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, sample_method);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, sample_method);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);	
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	// generate the texture
	if (n_channel==1) glTexImage2D(GL_TEXTURE_2D, 0, GL_R32F, width, height, 0, GL_RED, GL_FLOAT, data);
	if (n_channel==3) glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB32F, width, height, 0, GL_RGB, GL_FLOAT, data);
	if (n_channel==4) glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, width, height, 0, GL_RGBA, GL_FLOAT, data);
	if (gen_mipmap)
		glGenerateMipmap(GL_TEXTURE_2D);
	return texture;
}